

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

Result<wasm::WATParser::GlobalType> *
wasm::WATParser::globaltype<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::WATParser::GlobalType> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  Lexer *this;
  undefined8 *puVar1;
  _Uninitialized<wasm::Type,_true> _Var2;
  bool bVar3;
  bool bVar4;
  string_view expected;
  undefined1 local_c0 [8];
  Result<wasm::Type> type;
  long local_88;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  undefined1 local_58 [8];
  Result<wasm::Type> _val;
  
  this = &ctx->in;
  expected._M_str = "mut";
  expected._M_len = 3;
  bVar3 = Lexer::takeSExprStart(this,expected);
  valtype<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::Type> *)local_c0,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_58,
             (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_c0);
  if (_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_58,
               (undefined1 *)
               ((long)_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                      super__Move_assign_alias<wasm::Type,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first._M_storage.
                      id + (long)local_58));
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> = puVar1;
    if (local_78 == &local_68) {
      *puVar1 = CONCAT71(uStack_67,local_68);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x18) =
           uStack_60;
    }
    else {
      *(undefined1 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> = local_78;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x10)
           = CONCAT71(uStack_67,local_68);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 8) = local_70;
    local_70 = 0;
    local_68 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20) = '\x01';
    local_78 = &local_68;
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_58);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_58);
    if (bVar3) {
      bVar4 = Lexer::takeRParen(this);
      if (!bVar4) {
        type.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ = &stack0xffffffffffffff78;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),
                   "expected end of globaltype","");
        Lexer::err((Err *)local_58,this,
                   (string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x10
                 );
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> = puVar1;
        _Var2._M_storage.id =
             (Type)((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 8);
        if ((Type)local_58 == _Var2._M_storage.id) {
          *puVar1 = CONCAT71(_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._9_7_,
                             _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_1_);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x18) =
               _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> = local_58;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                            super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> +
                    0x10) =
               CONCAT71(_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                        super__Move_assign_alias<wasm::Type,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._9_7_,
                        _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                        super__Move_assign_alias<wasm::Type,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_1_);
        }
        ((_Uninitialized<wasm::Type,_true> *)
        ((long)&(__return_storage_ptr__->val).
                super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 8))->
        _M_storage = (Type)_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first.
                           _M_storage.id;
        _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first._M_storage.id =
             (_Uninitialized<wasm::Type,_true>)(Type)0x0;
        _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20) =
             '\x01';
        local_58 = (undefined1  [8])_Var2;
        if ((long *)type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ !=
            &stack0xffffffffffffff78) {
          operator_delete((void *)type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_,
                          local_88 + 1);
        }
        goto LAB_00bdaa36;
      }
    }
    *(uint *)&(__return_storage_ptr__->val).
              super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> = (uint)bVar3;
    ((_Uninitialized<wasm::Type,_true> *)
    ((long)&(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 8))->_M_storage =
         (Type)local_c0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20) = '\0';
  }
LAB_00bdaa36:
  std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_c0);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::GlobalTypeT> globaltype(Ctx& ctx) {
  auto mutability = Immutable;
  if (ctx.in.takeSExprStart("mut"sv)) {
    mutability = Mutable;
  }

  auto type = valtype(ctx);
  CHECK_ERR(type);

  if (mutability == Mutable && !ctx.in.takeRParen()) {
    return ctx.in.err("expected end of globaltype");
  }

  return ctx.makeGlobalType(mutability, *type);
}